

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O2

void to_suite::convert_integer(void)

{
  long *plVar1;
  integer_type iVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  bool bVar5;
  char cVar6;
  uchar uVar7;
  short sVar8;
  unsigned_short uVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  type_info *ptVar12;
  any result;
  integer_type input;
  undefined1 uStack_67;
  undefined2 uStack_66;
  undefined4 uStack_64;
  unsigned_long local_60;
  variable data;
  
  input = '\x02';
  data.storage.current = '\x02';
  data.storage.storage.__data[0] = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&result,&data);
  if (result.content == (placeholder *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    iVar10 = (*(result.content)->_vptr_placeholder[2])();
    ptVar12 = (type_info *)CONCAT44(extraout_var,iVar10);
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&signed_char::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x177,"void to_suite::convert_integer()",bVar5);
  cVar6 = boost::any_cast<signed_char>(&result);
  local_60 = CONCAT71(local_60._1_7_,cVar6);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x178,"void to_suite::convert_integer()",&local_60,&input);
  if (result.content != (placeholder *)0x0) {
    (*(result.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  input = '\x02';
  data.storage.current = '\x03';
  data.storage.storage.__data[0] = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&result,&data);
  if (result.content == (placeholder *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    iVar10 = (*(result.content)->_vptr_placeholder[2])();
    ptVar12 = (type_info *)CONCAT44(extraout_var_00,iVar10);
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&unsigned_char::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x17f,"void to_suite::convert_integer()",bVar5);
  uVar7 = boost::any_cast<unsigned_char>(&result);
  local_60 = CONCAT71(local_60._1_7_,uVar7);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x180,"void to_suite::convert_integer()",&local_60,&input);
  if (result.content != (placeholder *)0x0) {
    (*(result.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  input = '\x02';
  uStack_67 = 0;
  data.storage.current = '\x04';
  data.storage.storage._0_2_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&result,&data);
  if (result.content == (placeholder *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    iVar10 = (*(result.content)->_vptr_placeholder[2])();
    ptVar12 = (type_info *)CONCAT44(extraout_var_01,iVar10);
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&short::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x187,"void to_suite::convert_integer()",bVar5);
  sVar8 = boost::any_cast<short>(&result);
  local_60 = CONCAT62(local_60._2_6_,sVar8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x188,"void to_suite::convert_integer()",&local_60,&input);
  if (result.content != (placeholder *)0x0) {
    (*(result.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  input = '\x02';
  uStack_67 = 0;
  data.storage.current = '\x05';
  data.storage.storage._0_2_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&result,&data);
  if (result.content == (placeholder *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    iVar10 = (*(result.content)->_vptr_placeholder[2])();
    ptVar12 = (type_info *)CONCAT44(extraout_var_02,iVar10);
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&unsigned_short::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,399,"void to_suite::convert_integer()",bVar5);
  uVar9 = boost::any_cast<unsigned_short>(&result);
  local_60 = CONCAT62(local_60._2_6_,uVar9);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,400,"void to_suite::convert_integer()",&local_60,&input);
  if (result.content != (placeholder *)0x0) {
    (*(result.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  input = '\x02';
  iVar2 = input;
  uStack_67 = 0;
  uVar3 = uStack_67;
  uStack_66 = 0;
  uVar4 = uStack_66;
  data.storage.current = '\x06';
  data.storage.storage._0_4_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&result,&data);
  if (result.content == (placeholder *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    iVar10 = (*(result.content)->_vptr_placeholder[2])();
    ptVar12 = (type_info *)CONCAT44(extraout_var_03,iVar10);
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&int::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x197,"void to_suite::convert_integer()",bVar5);
  iVar10 = boost::any_cast<int>(&result);
  local_60 = CONCAT44(local_60._4_4_,iVar10);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x198,"void to_suite::convert_integer()",&local_60,&input);
  if (result.content != (placeholder *)0x0) {
    (*(result.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  data.storage.current = '\a';
  data.storage.storage._0_4_ = 2;
  input = iVar2;
  uStack_67 = uVar3;
  uStack_66 = uVar4;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&result,&data);
  if (result.content == (placeholder *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    iVar10 = (*(result.content)->_vptr_placeholder[2])();
    ptVar12 = (type_info *)CONCAT44(extraout_var_04,iVar10);
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&unsigned_int::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x19f,"void to_suite::convert_integer()",bVar5);
  uVar11 = boost::any_cast<unsigned_int>(&result);
  local_60 = CONCAT44(local_60._4_4_,uVar11);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a0,"void to_suite::convert_integer()",&local_60,&input);
  if (result.content != (placeholder *)0x0) {
    (*(result.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  result.content = (placeholder *)0x2;
  data.storage.current = '\b';
  data.storage.storage._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&input,&data);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 == (long *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar12 = (type_info *)(**(code **)(*plVar1 + 0x10))();
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a7,"void to_suite::convert_integer()",bVar5);
  local_60 = boost::any_cast<long>((any *)&input);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a8,"void to_suite::convert_integer()",&local_60,&result);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  result.content = (placeholder *)0x2;
  data.storage.current = '\t';
  data.storage.storage._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&input,&data);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 == (long *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar12 = (type_info *)(**(code **)(*plVar1 + 0x10))();
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&unsigned_long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1af,"void to_suite::convert_integer()",bVar5);
  local_60 = boost::any_cast<unsigned_long>((any *)&input);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b0,"void to_suite::convert_integer()",&local_60,&result);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  result.content = (placeholder *)0x2;
  data.storage.current = '\n';
  data.storage.storage._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&input,&data);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 == (long *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar12 = (type_info *)(**(code **)(*plVar1 + 0x10))();
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&long_long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b7,"void to_suite::convert_integer()",bVar5);
  local_60 = boost::any_cast<long_long>((any *)&input);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b8,"void to_suite::convert_integer()",&local_60,&result);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  result.content = (placeholder *)0x2;
  data.storage.current = '\v';
  data.storage.storage._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&input,&data);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 == (long *)0x0) {
    ptVar12 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar12 = (type_info *)(**(code **)(*plVar1 + 0x10))();
  }
  bVar5 = std::type_info::operator==(ptVar12,(type_info *)&unsigned_long_long::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1bf,"void to_suite::convert_integer()",bVar5);
  local_60 = boost::any_cast<unsigned_long_long>((any *)&input);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1c0,"void to_suite::convert_integer()",&local_60,&result);
  plVar1 = (long *)CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,input)));
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void convert_integer()
{
    {
        using integer_type = signed char;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned char;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed short int;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned short int;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed int;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned int;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed long int;
        integer_type input = 2L;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned long int;
        integer_type input = 2UL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed long long int;
        integer_type input = 2LL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned long long int;
        integer_type input = 2ULL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
}